

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O1

void __thiscall duckdb::MultiFileOptions::AddBatchInfo(MultiFileOptions *this,BindInfo *bind_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string local_1a0;
  string local_180;
  Value local_160;
  Value local_120;
  Value local_e0;
  Value local_a0;
  Value local_60;
  
  paVar1 = &local_1a0.field_2;
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"filename","");
  pcVar2 = (this->filename_column)._M_dataplus._M_p;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar2,pcVar2 + (this->filename_column)._M_string_length);
  Value::Value(&local_60,&local_180);
  BindInfo::InsertOption(bind_info,&local_1a0,&local_60);
  Value::~Value(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"hive_partitioning","");
  Value::BOOLEAN(&local_a0,this->hive_partitioning);
  BindInfo::InsertOption(bind_info,&local_1a0,&local_a0);
  Value::~Value(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,"auto_detect_hive_partitioning","");
  Value::BOOLEAN(&local_e0,this->auto_detect_hive_partitioning);
  BindInfo::InsertOption(bind_info,&local_1a0,&local_e0);
  Value::~Value(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"union_by_name","");
  Value::BOOLEAN(&local_120,this->union_by_name);
  BindInfo::InsertOption(bind_info,&local_1a0,&local_120);
  Value::~Value(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_1a0._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"hive_types_autocast","");
  Value::BOOLEAN(&local_160,this->hive_types_autocast);
  BindInfo::InsertOption(bind_info,&local_1a0,&local_160);
  Value::~Value(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MultiFileOptions::AddBatchInfo(BindInfo &bind_info) const {
	bind_info.InsertOption("filename", Value(filename_column));
	bind_info.InsertOption("hive_partitioning", Value::BOOLEAN(hive_partitioning));
	bind_info.InsertOption("auto_detect_hive_partitioning", Value::BOOLEAN(auto_detect_hive_partitioning));
	bind_info.InsertOption("union_by_name", Value::BOOLEAN(union_by_name));
	bind_info.InsertOption("hive_types_autocast", Value::BOOLEAN(hive_types_autocast));
}